

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb_fastpforlib::internal::__fastunpack4(uint8_t *in,uint8_t *out)

{
  byte bVar1;
  long lVar2;
  
  for (lVar2 = 0; (char)lVar2 != '\x04'; lVar2 = lVar2 + 1) {
    bVar1 = in[lVar2];
    out[lVar2 * 2] = bVar1 & 0xf;
    out[lVar2 * 2 + 1] = bVar1 >> 4;
  }
  return;
}

Assistant:

void __fastunpack4(const uint8_t *__restrict in, uint8_t *__restrict out) {
	for (uint8_t outer = 0; outer < 4; ++outer) {
		for (uint8_t inwordpointer = 0; inwordpointer < 8; inwordpointer += 4)
			*(out++) = ((*in) >> inwordpointer) % (1U << 4);
		++in;
	}
}